

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgent.h
# Opt level: O0

ssize_t __thiscall
SyncRetEventAgent<TestClass::CopyCounterGuy>::send
          (SyncRetEventAgent<TestClass::CopyCounterGuy> *this,int __fd,void *__buf,size_t __n,
          int __flags)

{
  uint uVar1;
  undefined4 in_register_00000034;
  EventAgent *obj;
  SmartPtr<EventAgent> local_28;
  SmartPtr<EventAgent> holdMe;
  IEventDispatcher *dispatcher_local;
  SyncRetEventAgent<TestClass::CopyCounterGuy> *this_local;
  
  obj = (EventAgent *)CONCAT44(in_register_00000034,__fd);
  holdMe.mObj = (EventAgent *)__buf;
  SmartPtr<EventAgent>::SmartPtr(&local_28,obj);
  uVar1 = (*((holdMe.mObj)->super_Event).super_RefCount._vptr_RefCount[7])();
  if ((uVar1 & 1) == 0) {
    (**((holdMe.mObj)->super_Event).super_RefCount._vptr_RefCount)(holdMe.mObj,obj);
  }
  else {
    (*(obj->super_Event).super_RefCount._vptr_RefCount[3])();
  }
  TestClass::CopyCounterGuy::CopyCounterGuy
            ((CopyCounterGuy *)this,(CopyCounterGuy *)&(obj->super_Event).field_0x14);
  SmartPtr<EventAgent>::~SmartPtr(&local_28);
  return (ssize_t)this;
}

Assistant:

ReturnType send(IEventDispatcher *dispatcher)
	{
		// The SyncRetEventAgent needs to make sure that after it
		// is dispatched and delivered the agent remains valid until
		// we are ready to return the value we filled in in the deliver
		// method.   In this case though we are going to use the
		// SmartPtr<> template and C++ scoping to do the AddRef and
		// Release so that we can return mRetValue directly without
		// making an explicit copy on the stack.
		
		// This is necessary because as soon as the dispatcher->sendEventSync
		// returns the only gauranteed reference to "this" object is the
		// one that is taken in this method.   Once we release that reference
		// "this" is possibly invalid and should not be accessed by again
		// before the method returns.
		
		SmartPtr<EventAgent> holdMe = this;
		
		if (dispatcher->isThreadCurrent())
		{
			deliver();
		}
		else
		{
			dispatcher->sendEventSync(this);
		}
		
		// Return the filled in return value.   This will make
		// an appropriate copy of mRetValue before the SmartPtr<>
		// falls out of scope and releases this object.
		return mRetValue;
	}